

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_perform_command(connectdata *conn)

{
  void *pvVar1;
  char *pcVar2;
  undefined8 *puVar3;
  CURLcode CVar4;
  char *pcVar5;
  
  pvVar1 = (conn->data->req).protop;
  pcVar2 = *(char **)((long)pvVar1 + 8);
  puVar3 = *(undefined8 **)((long)pvVar1 + 0x10);
  if (puVar3 == (undefined8 *)0x0) {
    if (pcVar2 == (char *)0x0) {
      pcVar5 = "HELP";
    }
    else {
      pcVar5 = "HELP";
      if (*pcVar2 != '\0') {
        pcVar5 = pcVar2;
      }
    }
    CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar5);
  }
  else {
    if (pcVar2 == (char *)0x0) {
      pcVar5 = "VRFY";
    }
    else {
      pcVar5 = "VRFY";
      if (*pcVar2 != '\0') {
        pcVar5 = pcVar2;
      }
    }
    CVar4 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",pcVar5,*puVar3);
  }
  if (CVar4 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_LIST;
  }
  return CVar4;
}

Assistant:

static CURLcode smtp_perform_command(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  /* Send the command */
  if(smtp->rcpt)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s %s",
                            smtp->custom && smtp->custom[0] != '\0' ?
                            smtp->custom : "VRFY",
                            smtp->rcpt->data);
  else
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s",
                           smtp->custom && smtp->custom[0] != '\0' ?
                           smtp->custom : "HELP");

  if(!result)
    state(conn, SMTP_COMMAND);

  return result;
}